

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O0

boolean set_quality_ratings(j_compress_ptr cinfo,char *arg,boolean force_baseline)

{
  int iVar1;
  undefined4 in_EDX;
  char *in_RSI;
  bool bVar2;
  char ch;
  int tblno;
  int val;
  char local_25;
  int force_baseline_00;
  int quality;
  char *local_18;
  
  quality = 0x4b;
  force_baseline_00 = 0;
  local_18 = in_RSI;
  do {
    if (3 < force_baseline_00) {
      jpeg_default_qtables((j_compress_ptr)CONCAT44(in_EDX,quality),force_baseline_00);
      return 1;
    }
    if (*local_18 == '\0') {
      iVar1 = jpeg_quality_scaling(quality);
      q_scale_factor[force_baseline_00] = iVar1;
    }
    else {
      local_25 = ',';
      iVar1 = __isoc99_sscanf(local_18,"%d%c",&stack0xffffffffffffffe0,&local_25);
      if (iVar1 < 1) {
        return 0;
      }
      if (local_25 != ',') {
        return 0;
      }
      iVar1 = jpeg_quality_scaling(quality);
      q_scale_factor[force_baseline_00] = iVar1;
      do {
        bVar2 = false;
        if (*local_18 != '\0') {
          bVar2 = *local_18 != ',';
          local_18 = local_18 + 1;
        }
      } while (bVar2);
    }
    force_baseline_00 = force_baseline_00 + 1;
  } while( true );
}

Assistant:

GLOBAL(boolean)
set_quality_ratings(j_compress_ptr cinfo, char *arg, boolean force_baseline)
/* Process a quality-ratings parameter string, of the form
 *     N[,N,...]
 * If there are more q-table slots than parameters, the last value is replicated.
 */
{
  int val = 75;                 /* default value */
  int tblno;
  char ch;

  for (tblno = 0; tblno < NUM_QUANT_TBLS; tblno++) {
    if (*arg) {
      ch = ',';                 /* if not set by sscanf, will be ',' */
      if (sscanf(arg, "%d%c", &val, &ch) < 1)
        return FALSE;
      if (ch != ',')            /* syntax check */
        return FALSE;
      /* Convert user 0-100 rating to percentage scaling */
#if JPEG_LIB_VERSION >= 70
      cinfo->q_scale_factor[tblno] = jpeg_quality_scaling(val);
#else
      q_scale_factor[tblno] = jpeg_quality_scaling(val);
#endif
      while (*arg && *arg++ != ','); /* advance to next segment of arg
                                        string */
    } else {
      /* reached end of parameter, set remaining factors to last value */
#if JPEG_LIB_VERSION >= 70
      cinfo->q_scale_factor[tblno] = jpeg_quality_scaling(val);
#else
      q_scale_factor[tblno] = jpeg_quality_scaling(val);
#endif
    }
  }
  jpeg_default_qtables(cinfo, force_baseline);
  return TRUE;
}